

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall soul::heart::Printer::PrinterStream::printLatency(PrinterStream *this)

{
  CodePrinter *pCVar1;
  PrinterStream *this_local;
  
  if (this->module->latency != 0) {
    pCVar1 = choc::text::CodePrinter::operator<<(this->out,"processor.latency = ");
    pCVar1 = choc::text::CodePrinter::operator<<(pCVar1,this->module->latency);
    pCVar1 = choc::text::CodePrinter::operator<<(pCVar1,";");
    choc::text::CodePrinter::operator<<(pCVar1,(NewLine *)&newLine);
  }
  return;
}

Assistant:

void printLatency()
        {
            if (module.latency != 0)
                out << "processor.latency = " << module.latency << ";" << newLine;
        }